

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O2

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,OrExpr *ptr)

{
  int iVar1;
  
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  iVar1 = this->result;
  (**(ptr->second->super_Base)._vptr_Base)(ptr->second,this);
  this->result = (uint)(iVar1 != 0 || this->result != 0);
  return;
}

Assistant:

void interpreter_visitor::visit(OrExpr* ptr) {

    ptr->first->accept(this);
    auto first = result;
    ptr->second->accept(this);
    result = (first || result);
}